

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O0

void __thiscall
Array_new_array_by_value_Test::~Array_new_array_by_value_Test(Array_new_array_by_value_Test *this)

{
  Array_new_array_by_value_Test *this_local;
  
  ~Array_new_array_by_value_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Array,new_array_by_value) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // create range by value of length 10
    // this should allocate memory of length 10*sizeof(T)
    by_value v1(10);
    EXPECT_EQ(v1.size(), 10);

    // create a copy
    by_value v2(v1);
    EXPECT_EQ(v2.size(), v1.size());
    EXPECT_NE(v2.data(), v1.data());

    by_reference r1(v1);
    EXPECT_EQ(r1.size(), v1.size());
    EXPECT_EQ(r1.data(), v1.data());
    by_value v3(r1);
    EXPECT_EQ(v3.size(), r1.size());
    EXPECT_NE(v3.data(), r1.data());
}